

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralExpressions.cpp
# Opt level: O0

Expression *
slang::ast::UnbasedUnsizedIntegerLiteral::fromSyntax
          (Compilation *compilation,LiteralExpressionSyntax *syntax)

{
  logic_t lVar1;
  bool bVar2;
  UnbasedUnsizedIntegerLiteral *pUVar3;
  BumpAllocator *in_RSI;
  SourceRange SVar4;
  SyntaxNode *in_stack_00000010;
  logic_t val;
  bitwidth_t in_stack_00000084;
  Compilation *in_stack_00000088;
  bitmask<slang::ast::IntegralFlags> in_stack_00000097;
  Token *in_stack_ffffffffffffffb8;
  IntegralFlags local_29;
  undefined7 in_stack_ffffffffffffffe8;
  
  lVar1 = parsing::Token::bitValue(in_stack_ffffffffffffffb8);
  bVar2 = logic_t::isUnknown((logic_t *)&stack0xffffffffffffffef);
  local_29 = FourState;
  if (!bVar2) {
    local_29 = TwoState;
  }
  bitmask<slang::ast::IntegralFlags>::bitmask
            ((bitmask<slang::ast::IntegralFlags> *)&stack0xffffffffffffffee,local_29);
  Compilation::getType(in_stack_00000088,in_stack_00000084,in_stack_00000097);
  SVar4 = slang::syntax::SyntaxNode::sourceRange(in_stack_00000010);
  pUVar3 = BumpAllocator::
           emplace<slang::ast::UnbasedUnsizedIntegerLiteral,slang::ast::Type_const&,slang::logic_t&,slang::SourceRange>
                     (in_RSI,(Type *)CONCAT17(lVar1.value,in_stack_ffffffffffffffe8),
                      (logic_t *)SVar4.endLoc,(SourceRange *)SVar4.startLoc);
  return &pUVar3->super_Expression;
}

Assistant:

Expression& UnbasedUnsizedIntegerLiteral::fromSyntax(Compilation& compilation,
                                                     const LiteralExpressionSyntax& syntax) {
    SLANG_ASSERT(syntax.kind == SyntaxKind::UnbasedUnsizedLiteralExpression);

    // UnsizedUnbasedLiteralExpressions default to a size of 1 in an undetermined
    // context, but can grow to be wider during propagation.
    logic_t val = syntax.literal.bitValue();
    return *compilation.emplace<UnbasedUnsizedIntegerLiteral>(
        compilation.getType(1,
                            val.isUnknown() ? IntegralFlags::FourState : IntegralFlags::TwoState),
        val, syntax.sourceRange());
}